

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReactorCvode.cpp
# Opt level: O2

int __thiscall pele::physics::reactions::ReactorCvode::init(ReactorCvode *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  Context *pCVar5;
  N_Vector p_Var6;
  void *pvVar7;
  CVODEUserData *pCVar8;
  SUNNonlinearSolver flagvalue;
  SUNLinearSolver p_Var9;
  SUNMatrix p_Var10;
  int in_EDX;
  int iVar11;
  char *msg;
  int length;
  int flag;
  allocator local_229;
  Context *local_228;
  Real local_220;
  Real local_218;
  ParmParse pp;
  Print local_1b8;
  
  iVar3 = (int)ctx;
  this->m_reactor_type = iVar3;
  ReactorTypes::check_reactor_type(iVar3);
  std::__cxx11::string::string((string *)&local_1b8,"ode",(allocator *)&flag);
  amrex::ParmParse::ParmParse(&pp,(string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  amrex::ParmParse::query
            (&pp,"verbose",
             &(this->super_Register<pele::physics::reactions::ReactorCvode>).super_ReactorBase.
              verbose,0);
  amrex::ParmParse::query(&pp,"rtol",&this->relTol,0);
  amrex::ParmParse::query(&pp,"atol",&this->absTol,0);
  amrex::ParmParse::query(&pp,"atomic_reductions",&this->atomic_reductions,0);
  amrex::ParmParse::query(&pp,"max_nls_iters",&this->max_nls_iters,0);
  amrex::ParmParse::query(&pp,"max_fp_accel",&this->max_fp_accel,0);
  amrex::ParmParse::query(&pp,"clean_init_massfrac",&this->m_clean_init_massfrac,0);
  checkCvodeOptions(this);
  poVar4 = amrex::OutStream();
  amrex::Print::Print(&local_1b8,poVar4);
  std::operator<<((ostream *)&local_1b8.ss,"Initializing CVODE:\n");
  amrex::Print::~Print(&local_1b8);
  if (this->atomic_reductions == 0) {
    poVar4 = amrex::OutStream();
    amrex::Print::Print(&local_1b8,poVar4);
    std::operator<<((ostream *)&local_1b8.ss,"  Using LDS reductions\n");
  }
  else {
    poVar4 = amrex::OutStream();
    amrex::Print::Print(&local_1b8,poVar4);
    std::operator<<((ostream *)&local_1b8.ss,"  Using atomic reductions\n");
  }
  amrex::Print::~Print(&local_1b8);
  pCVar5 = amrex::sundials::The_Sundials_Context(0);
  length = in_EDX * 0x16;
  p_Var6 = N_VNew_Serial(length,*(pCVar5->sunctx_)._M_t.
                                 super___uniq_ptr_impl<_SUNContext_*,_std::default_delete<_SUNContext_*>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,__SUNContext_**,_std::default_delete<_SUNContext_*>_>
                                 .super__Head_base<0UL,__SUNContext_**,_false>._M_head_impl);
  this->y = p_Var6;
  iVar2 = utils::check_flag(p_Var6,"N_VNew_Serial",0);
  iVar11 = 1;
  if (iVar2 != 0) goto LAB_001b2426;
  pCVar5 = amrex::sundials::The_Sundials_Context(0);
  pvVar7 = CVodeCreate(2,*(pCVar5->sunctx_)._M_t.
                          super___uniq_ptr_impl<_SUNContext_*,_std::default_delete<_SUNContext_*>_>.
                          _M_t.
                          super__Tuple_impl<0UL,__SUNContext_**,_std::default_delete<_SUNContext_*>_>
                          .super__Head_base<0UL,__SUNContext_**,_false>._M_head_impl);
  this->cvode_mem = pvVar7;
  iVar2 = utils::check_flag(pvVar7,"CVodeCreate",0);
  if (iVar2 != 0) goto LAB_001b2426;
  pCVar8 = (CVODEUserData *)operator_new(0xd8);
  pCVar8->gamma = 0.0;
  pCVar8->nbBlocks = 0;
  pCVar8->nbThreads = 0;
  pCVar8->mask = (int *)0x0;
  pCVar8->FCunt = (int *)0x0;
  pCVar8->rhoesrc_ext = (Real *)0x0;
  pCVar8->rYsrc_ext = (Real *)0x0;
  pCVar8->precond_type = 0;
  pCVar8->NNZ = 0;
  pCVar8->rhoe_init = (Real *)0x0;
  pCVar8->maxOrder = 0;
  pCVar8->reactor_type = 0;
  pCVar8->analytical_jacobian = 0;
  pCVar8->solve_type = 0;
  pCVar8->dt_save = 0.0;
  pCVar8->ncells = 0;
  pCVar8->verbose = 0;
  pCVar8->FirstTimePrecond = false;
  pCVar8->Jdata = (Real **)0x0;
  pCVar8->PS = (SUNMatrix *)0x0;
  pCVar8->rowVals = (int **)0x0;
  pCVar8->rowPtrs = (int **)0x0;
  pCVar8->colPtrs = (int **)0x0;
  pCVar8->colVals = (int **)0x0;
  pCVar8->indx = (int *)0x0;
  pCVar8->JSPSmat = (Real **)0x0;
  pCVar8->Jbd = (Real ****)0x0;
  pCVar8->P = (Real ****)0x0;
  pCVar8->pivot = (sunindextype ***)0x0;
  pCVar8->PSc = (SUNMatrix)0x0;
  pCVar8->colVals_c = (int *)0x0;
  pCVar8->rowPtrs_c = (int *)0x0;
  this->udata_g = pCVar8;
  allocUserData(this,pCVar8,in_EDX);
  iVar2 = utils::check_flag(this->udata_g,"allocUserData",2);
  if (iVar2 != 0) goto LAB_001b2426;
  flag = CVodeSetUserData(this->cvode_mem,this->udata_g);
  iVar11 = 1;
  iVar2 = utils::check_flag(&flag,"CVodeSetUserData",1);
  if (iVar2 != 0) goto LAB_001b2426;
  flag = CVodeInit(this->cvode_mem,cF_RHS,0.0,this->y);
  iVar11 = 1;
  iVar2 = utils::check_flag(&flag,"CVodeInit",1);
  if (iVar2 != 0) goto LAB_001b2426;
  local_228 = amrex::sundials::The_Sundials_Context(0);
  pvVar7 = this->cvode_mem;
  iVar2 = this->udata_g->ncells;
  local_218 = this->relTol;
  local_220 = this->absTol;
  std::__cxx11::string::string((string *)&local_1b8,"cvode",&local_229);
  ReactorBase::set_sundials_solver_tols
            ((ReactorBase *)this,local_228,pvVar7,iVar2,local_218,local_220,(string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  pCVar8 = this->udata_g;
  switch(pCVar8->solve_type) {
  case 0:
    p_Var6 = this->y;
    iVar3 = this->max_fp_accel;
    pCVar5 = amrex::sundials::The_Sundials_Context(0);
    flagvalue = SUNNonlinSol_FixedPoint
                          (p_Var6,iVar3,
                           *(pCVar5->sunctx_)._M_t.
                            super___uniq_ptr_impl<_SUNContext_*,_std::default_delete<_SUNContext_*>_>
                            ._M_t.
                            super__Tuple_impl<0UL,__SUNContext_**,_std::default_delete<_SUNContext_*>_>
                            .super__Head_base<0UL,__SUNContext_**,_false>._M_head_impl);
    this->NLS = flagvalue;
    iVar3 = utils::check_flag(flagvalue,"SUNNonlinSol_FixedPoint",0);
    if (iVar3 != 0) goto LAB_001b2426;
    flag = CVodeSetNonlinearSolver(this->cvode_mem,this->NLS);
    iVar3 = utils::check_flag(&flag,"CVodeSetNonlinearSolver",1);
    break;
  case 1:
  case 2:
    pCVar5 = amrex::sundials::The_Sundials_Context(0);
    p_Var10 = SUNDenseMatrix(length,length,
                             *(pCVar5->sunctx_)._M_t.
                              super___uniq_ptr_impl<_SUNContext_*,_std::default_delete<_SUNContext_*>_>
                              ._M_t.
                              super__Tuple_impl<0UL,__SUNContext_**,_std::default_delete<_SUNContext_*>_>
                              .super__Head_base<0UL,__SUNContext_**,_false>._M_head_impl);
    this->A = p_Var10;
    iVar3 = utils::check_flag(p_Var10,"SUNDenseMatrix",0);
    if (iVar3 != 0) goto LAB_001b2426;
    p_Var6 = this->y;
    p_Var10 = this->A;
    pCVar5 = amrex::sundials::The_Sundials_Context(0);
    p_Var9 = SUNLinSol_Dense(p_Var6,p_Var10,
                             *(pCVar5->sunctx_)._M_t.
                              super___uniq_ptr_impl<_SUNContext_*,_std::default_delete<_SUNContext_*>_>
                              ._M_t.
                              super__Tuple_impl<0UL,__SUNContext_**,_std::default_delete<_SUNContext_*>_>
                              .super__Head_base<0UL,__SUNContext_**,_false>._M_head_impl);
    this->LS = p_Var9;
    iVar3 = utils::check_flag(p_Var9,"SUNLinSol_Dense",0);
    if (iVar3 != 0) goto LAB_001b2426;
    flag = CVodeSetLinearSolver(this->cvode_mem,this->LS,this->A);
    iVar3 = utils::check_flag(&flag,"CVodeSetLinearSolver",1);
    break;
  case 3:
    msg = "sparseDirect solver_type not valid without KLU library.";
    goto LAB_001b25b4;
  case 4:
    iVar2 = pCVar8->ncells;
    iVar1 = pCVar8->NNZ;
    pCVar5 = amrex::sundials::The_Sundials_Context(0);
    iVar11 = 1;
    p_Var10 = SUNSparseMatrix(length,length,iVar2 * iVar1,1,
                              *(pCVar5->sunctx_)._M_t.
                               super___uniq_ptr_impl<_SUNContext_*,_std::default_delete<_SUNContext_*>_>
                               ._M_t.
                               super__Tuple_impl<0UL,__SUNContext_**,_std::default_delete<_SUNContext_*>_>
                               .super__Head_base<0UL,__SUNContext_**,_false>._M_head_impl);
    this->A = p_Var10;
    iVar2 = utils::check_flag(p_Var10,"SUNDenseMatrix",0);
    if (iVar2 != 0) goto LAB_001b2426;
    p_Var6 = this->y;
    p_Var10 = this->A;
    iVar2 = this->udata_g->ncells;
    local_228 = (Context *)CONCAT44(local_228._4_4_,this->udata_g->NNZ);
    pCVar5 = amrex::sundials::The_Sundials_Context(0);
    p_Var9 = cvode::SUNLinSol_sparse_custom
                       (p_Var6,p_Var10,iVar3,iVar2,0x16,(int)local_228,
                        *(pCVar5->sunctx_)._M_t.
                         super___uniq_ptr_impl<_SUNContext_*,_std::default_delete<_SUNContext_*>_>.
                         _M_t.
                         super__Tuple_impl<0UL,__SUNContext_**,_std::default_delete<_SUNContext_*>_>
                         .super__Head_base<0UL,__SUNContext_**,_false>._M_head_impl);
    this->LS = p_Var9;
    iVar3 = utils::check_flag(p_Var9,"SUNLinSol_sparse_custom",0);
    if (iVar3 != 0) goto LAB_001b2426;
    flag = CVodeSetLinearSolver(this->cvode_mem,this->LS,this->A);
    iVar3 = utils::check_flag(&flag,"CVodeSetLinearSolver",1);
    break;
  case 5:
    p_Var6 = this->y;
    pCVar5 = amrex::sundials::The_Sundials_Context(0);
    p_Var9 = SUNLinSol_SPGMR(p_Var6,0,0,
                             *(pCVar5->sunctx_)._M_t.
                              super___uniq_ptr_impl<_SUNContext_*,_std::default_delete<_SUNContext_*>_>
                              ._M_t.
                              super__Tuple_impl<0UL,__SUNContext_**,_std::default_delete<_SUNContext_*>_>
                              .super__Head_base<0UL,__SUNContext_**,_false>._M_head_impl);
    this->LS = p_Var9;
    iVar3 = utils::check_flag(p_Var9,"SUNLinSol_SPGMR",0);
    if (iVar3 != 0) goto LAB_001b2426;
    flag = CVodeSetLinearSolver(this->cvode_mem,this->LS,(SUNMatrix)0x0);
    iVar3 = utils::check_flag(&flag,"CVodeSetLinearSolver",1);
    break;
  case 6:
    p_Var6 = this->y;
    pCVar5 = amrex::sundials::The_Sundials_Context(0);
    iVar11 = 1;
    p_Var9 = SUNLinSol_SPGMR(p_Var6,1,0,
                             *(pCVar5->sunctx_)._M_t.
                              super___uniq_ptr_impl<_SUNContext_*,_std::default_delete<_SUNContext_*>_>
                              ._M_t.
                              super__Tuple_impl<0UL,__SUNContext_**,_std::default_delete<_SUNContext_*>_>
                              .super__Head_base<0UL,__SUNContext_**,_false>._M_head_impl);
    this->LS = p_Var9;
    iVar3 = utils::check_flag(p_Var9,"SUNLinSol_SPGMR",0);
    if (iVar3 != 0) goto LAB_001b2426;
    flag = CVodeSetLinearSolver(this->cvode_mem,this->LS,(SUNMatrix)0x0);
    iVar3 = utils::check_flag(&flag,"CVodeSetLinearSolver",1);
    break;
  default:
    msg = "Wrong choice of linear solver...";
LAB_001b25b4:
    amrex::Abort_host(msg);
    goto LAB_001b280b;
  }
  iVar11 = 1;
  if (iVar3 != 0) goto LAB_001b2426;
LAB_001b280b:
  if (this->udata_g->analytical_jacobian == 1) {
    iVar3 = this->udata_g->solve_type;
    if (iVar3 == 4) {
      flag = CVodeSetJacFn(this->cvode_mem,cvode::cJac_sps);
      iVar3 = utils::check_flag(&flag,"CVodeSetJacFn",1);
LAB_001b2894:
      iVar11 = 1;
      if (iVar3 != 0) goto LAB_001b2426;
    }
    else if (iVar3 == 3) {
      amrex::Abort_host(
                       "Shouldn\'t be there: sparseDirect solver_type not valid without KLU library."
                       );
    }
    else if (iVar3 == 2) {
      flag = CVodeSetJacFn(this->cvode_mem,cvode::cJac);
      iVar3 = utils::check_flag(&flag,"CVodeSetJacFn",1);
      goto LAB_001b2894;
    }
  }
  iVar3 = this->udata_g->precond_type;
  if (iVar3 == 2) {
    flag = CVodeSetJacTimes(this->cvode_mem,(CVLsJacTimesSetupFn)0x0,(CVLsJacTimesVecFn)0x0);
    iVar11 = 1;
    iVar3 = utils::check_flag(&flag,"CVodeSetJacTimes",1);
    if (iVar3 != 0) goto LAB_001b2426;
    flag = CVodeSetPreconditioner(this->cvode_mem,cvode::Precond_custom,cvode::PSolve_custom);
    iVar3 = utils::check_flag(&flag,"CVodeSetPreconditioner",1);
LAB_001b298c:
    iVar11 = 1;
    if (iVar3 != 0) goto LAB_001b2426;
  }
  else if (iVar3 == 1) {
    amrex::Abort_host("sparseSimpleAJac precond_type not valid without KLU library.");
  }
  else if (iVar3 == 0) {
    flag = CVodeSetJacTimes(this->cvode_mem,(CVLsJacTimesSetupFn)0x0,(CVLsJacTimesVecFn)0x0);
    iVar11 = 1;
    iVar3 = utils::check_flag(&flag,"CVodeSetJacTimes",1);
    if (iVar3 != 0) goto LAB_001b2426;
    flag = CVodeSetPreconditioner(this->cvode_mem,cvode::Precond,cvode::PSolve);
    iVar3 = utils::check_flag(&flag,"CVodeSetPreconditioner",1);
    goto LAB_001b298c;
  }
  flag = CVodeSetMaxNonlinIters(this->cvode_mem,this->max_nls_iters);
  iVar11 = 1;
  iVar3 = utils::check_flag(&flag,"CVodeSetMaxNonlinIters",1);
  if (iVar3 == 0) {
    flag = CVodeSetMaxErrTestFails(this->cvode_mem,100);
    iVar11 = 1;
    iVar3 = utils::check_flag(&flag,"CVodeSetMaxErrTestFails",1);
    if (iVar3 == 0) {
      flag = CVodeSetErrHandlerFn(this->cvode_mem,cvode::cvodeErrHandler,(void *)0x0);
      iVar11 = 1;
      iVar3 = utils::check_flag(&flag,"CVodeSetErrHandlerFn",1);
      if (iVar3 == 0) {
        flag = CVodeSetMaxNumSteps(this->cvode_mem,10000);
        iVar11 = 1;
        iVar3 = utils::check_flag(&flag,"CVodeSetMaxNumSteps",1);
        if (iVar3 == 0) {
          flag = CVodeSetMaxOrd(this->cvode_mem,this->udata_g->maxOrder);
          iVar11 = 1;
          iVar3 = utils::check_flag(&flag,"CVodeSetMaxOrd",1);
          if (iVar3 == 0) {
            if (this->LS != (SUNLinearSolver)0x0) {
              flag = CVodeSetJacEvalFrequency(this->cvode_mem,100);
              iVar11 = 1;
              iVar3 = utils::check_flag(&flag,"CVodeSetJacEvalFrequency",1);
              if (iVar3 != 0) goto LAB_001b2426;
            }
            iVar11 = 0;
          }
        }
      }
    }
  }
LAB_001b2426:
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&pp);
  return iVar11;
}

Assistant:

int
ReactorCvode::init(int reactor_type, int ncells)
{
  BL_PROFILE("Pele::ReactorCvode::init()");
  m_reactor_type = reactor_type;
  ReactorTypes::check_reactor_type(m_reactor_type);
  amrex::ParmParse pp("ode");
  pp.query("verbose", verbose);
  pp.query("rtol", relTol);
  pp.query("atol", absTol);
  pp.query("atomic_reductions", atomic_reductions);
  pp.query("max_nls_iters", max_nls_iters);
  pp.query("max_fp_accel", max_fp_accel);
  pp.query("clean_init_massfrac", m_clean_init_massfrac);
  checkCvodeOptions();

  amrex::Print() << "Initializing CVODE:\n";

  if (atomic_reductions != 0) {
    amrex::Print() << "  Using atomic reductions\n";
  } else {
    amrex::Print() << "  Using LDS reductions\n";
  }

#ifndef AMREX_USE_GPU
  // ----------------------------------------------------------
  // On CPU, initialize cvode_mem/userData
  // ----------------------------------------------------------

  // Solution vector
  int neq_tot = (NUM_SPECIES + 1) * ncells;
  y = N_VNew_Serial(neq_tot, *amrex::sundials::The_Sundials_Context());
  if (utils::check_flag(static_cast<void*>(y), "N_VNew_Serial", 0) != 0) {
    return (1);
  }

  // Call CVodeCreate to create the solver memory and specify the Backward
  // Differentiation Formula and the use of a Newton iteration
  cvode_mem = CVodeCreate(CV_BDF, *amrex::sundials::The_Sundials_Context());
  if (utils::check_flag(static_cast<void*>(cvode_mem), "CVodeCreate", 0) != 0) {
    return (1);
  }

  udata_g = new CVODEUserData{};
  allocUserData(udata_g, ncells);
  if (utils::check_flag(static_cast<void*>(udata_g), "allocUserData", 2) != 0) {
    return (1);
  }

  // Set the pointer to user-defined data
  int flag = CVodeSetUserData(cvode_mem, udata_g);
  if (utils::check_flag(&flag, "CVodeSetUserData", 1) != 0) {
    return (1);
  }

  // Call CVodeInit to initialize the integrator memory and specify the user's
  // right hand side function, the inital time, and initial dependent variable
  // vector y.
  amrex::Real time = 0.0;
  flag = CVodeInit(cvode_mem, cF_RHS, time, y);
  if (utils::check_flag(&flag, "CVodeInit", 1) != 0) {
    return (1);
  }

  // Setup tolerances
  set_sundials_solver_tols(
    *amrex::sundials::The_Sundials_Context(), cvode_mem, udata_g->ncells,
    relTol, absTol, "cvode");

  // Linear solver data
  if (udata_g->solve_type == cvode::fixedPoint) {
    NLS = SUNNonlinSol_FixedPoint(
      y, max_fp_accel, *amrex::sundials::The_Sundials_Context());
    if (utils::check_flag(
          static_cast<void*>(NLS), "SUNNonlinSol_FixedPoint", 0)) {
      return (1);
    }

    flag = CVodeSetNonlinearSolver(cvode_mem, NLS);
    if (utils::check_flag(&flag, "CVodeSetNonlinearSolver", 1)) {
      return (1);
    }

  } else if (
    udata_g->solve_type == cvode::denseFDDirect ||
    udata_g->solve_type == cvode::denseDirect) {
    // Create dense SUNMatrix for use in linear solves
    A = SUNDenseMatrix(
      neq_tot, neq_tot, *amrex::sundials::The_Sundials_Context());
    if (utils::check_flag(static_cast<void*>(A), "SUNDenseMatrix", 0) != 0) {
      return (1);
    }

    // Create dense SUNLinearSolver object for use by CVode
    LS = SUNLinSol_Dense(y, A, *amrex::sundials::The_Sundials_Context());
    if (utils::check_flag(static_cast<void*>(LS), "SUNLinSol_Dense", 0) != 0) {
      return (1);
    }

    // Call CVodeSetLinearSolver to attach the matrix and linear solver to CVode
    flag = CVodeSetLinearSolver(cvode_mem, LS, A);
    if (utils::check_flag(&flag, "CVodeSetLinearSolver", 1) != 0) {
      return (1);
    }

  } else if (udata_g->solve_type == cvode::sparseDirect) {
#ifdef PELE_USE_KLU
    // Create sparse SUNMatrix for use in linear solves
    A = SUNSparseMatrix(
      neq_tot, neq_tot, (udata_g->NNZ) * udata_g->ncells, CSC_MAT,
      *amrex::sundials::The_Sundials_Context());
    if (utils::check_flag(static_cast<void*>(A), "SUNSparseMatrix", 0))
      return (1);

    // Create KLU solver object for use by CVode
    LS = SUNLinSol_KLU(y, A, *amrex::sundials::The_Sundials_Context());
    if (utils::check_flag(static_cast<void*>(LS), "SUNLinSol_KLU", 0))
      return (1);

    // Call CVodeSetLinearSolver to attach the matrix and linear solver to CVode
    flag = CVodeSetLinearSolver(cvode_mem, LS, A);
    if (utils::check_flag(&flag, "CVodeSetLinearSolver", 1))
      return (1);
#else
    amrex::Abort("sparseDirect solver_type not valid without KLU library.");
#endif

  } else if (udata_g->solve_type == cvode::customDirect) {
    // Create dense SUNMatrix for use in linear solves
    A = SUNSparseMatrix(
      neq_tot, neq_tot, (udata_g->NNZ) * udata_g->ncells, CSR_MAT,
      *amrex::sundials::The_Sundials_Context());
    if (utils::check_flag(static_cast<void*>(A), "SUNDenseMatrix", 0) != 0) {
      return (1);
    }

    // Create dense SUNLinearSolver object for use by CVode
    LS = cvode::SUNLinSol_sparse_custom(
      y, A, reactor_type, udata_g->ncells, (NUM_SPECIES + 1), udata_g->NNZ,
      *amrex::sundials::The_Sundials_Context());
    if (
      utils::check_flag(static_cast<void*>(LS), "SUNLinSol_sparse_custom", 0) !=
      0) {
      return (1);
    }

    // Call CVodeSetLinearSolver to attach the matrix and linear solver to CVode
    flag = CVodeSetLinearSolver(cvode_mem, LS, A);
    if (utils::check_flag(&flag, "CVodeSetLinearSolver", 1) != 0) {
      return (1);
    }

  } else if (udata_g->solve_type == cvode::GMRES) {
    // Create the GMRES linear solver object
    LS = SUNLinSol_SPGMR(
      y, SUN_PREC_NONE, 0, *amrex::sundials::The_Sundials_Context());
    if (utils::check_flag(static_cast<void*>(LS), "SUNLinSol_SPGMR", 0) != 0) {
      return (1);
    }

    // Set CVode linear solver to LS
    flag = CVodeSetLinearSolver(cvode_mem, LS, nullptr);
    if (utils::check_flag(&flag, "CVodeSetLinearSolver", 1) != 0) {
      return (1);
    }

  } else if (udata_g->solve_type == cvode::precGMRES) {
    // Create the GMRES linear solver object
    LS = SUNLinSol_SPGMR(
      y, SUN_PREC_LEFT, 0, *amrex::sundials::The_Sundials_Context());
    if (utils::check_flag(static_cast<void*>(LS), "SUNLinSol_SPGMR", 0) != 0) {
      return (1);
    }

    // Set CVode linear solver to LS
    flag = CVodeSetLinearSolver(cvode_mem, LS, nullptr);
    if (utils::check_flag(&flag, "CVodeSetLinearSolver", 1) != 0) {
      return (1);
    }

  } else {
    amrex::Abort("Wrong choice of linear solver...");
  }

  // Analytical Jac. data for direct solver
  if (udata_g->analytical_jacobian == 1) {
    if (udata_g->solve_type == cvode::denseDirect) {
      // Set the user-supplied Jacobian routine Jac
      flag = CVodeSetJacFn(cvode_mem, cvode::cJac);
      if (utils::check_flag(&flag, "CVodeSetJacFn", 1) != 0) {
        return (1);
      }
    } else if (udata_g->solve_type == cvode::sparseDirect) {
#ifdef PELE_USE_KLU
      // Set the user-supplied KLU Jacobian routine Jac
      flag = CVodeSetJacFn(cvode_mem, cvode::cJac_KLU);
      if (utils::check_flag(&flag, "CVodeSetJacFn", 1))
        return (1);
#else
      amrex::Abort(
        "Shouldn't be there: sparseDirect solver_type not valid without "
        "KLU library.");
#endif
    } else if (udata_g->solve_type == cvode::customDirect) {
      // Set the user-supplied Jacobian routine Jac
      flag = CVodeSetJacFn(cvode_mem, cvode::cJac_sps);
      if (utils::check_flag(&flag, "CVodeSetJacFn", 1) != 0) {
        return (1);
      }
    }
  }

  // Analytical Jac. data for iterative solver preconditioner
  if (udata_g->precond_type == cvode::denseSimpleAJac) {
    // Set the JAcobian-times-vector function
    flag = CVodeSetJacTimes(cvode_mem, nullptr, nullptr);
    if (utils::check_flag(&flag, "CVodeSetJacTimes", 1) != 0) {
      return (1);
    }
    // Set the preconditioner plain dense solve and setup functions
    flag = CVodeSetPreconditioner(cvode_mem, cvode::Precond, cvode::PSolve);
    if (utils::check_flag(&flag, "CVodeSetPreconditioner", 1) != 0) {
      return (1);
    }
  } else if (udata_g->precond_type == cvode::sparseSimpleAJac) {
#ifdef PELE_USE_KLU
    // Set the JAcobian-times-vector function
    flag = CVodeSetJacTimes(cvode_mem, nullptr, nullptr);
    if (utils::check_flag(&flag, "CVodeSetJacTimes", 1))
      return (1);
    // Set the preconditioner KLU sparse solve and setup functions
    flag = CVodeSetPreconditioner(
      cvode_mem, cvode::Precond_sparse, cvode::PSolve_sparse);
    if (utils::check_flag(&flag, "CVodeSetPreconditioner", 1))
      return (1);
#else
    amrex::Abort(
      "sparseSimpleAJac precond_type not valid without KLU library.");
#endif
  } else if (udata_g->precond_type == cvode::customSimpleAJac) {
    // Set the JAcobian-times-vector function
    flag = CVodeSetJacTimes(cvode_mem, nullptr, nullptr);
    if (utils::check_flag(&flag, "CVodeSetJacTimes", 1) != 0) {
      return (1);
    }
    // Set the preconditioner to custom solve and setup functions
    flag = CVodeSetPreconditioner(
      cvode_mem, cvode::Precond_custom, cvode::PSolve_custom);
    if (utils::check_flag(&flag, "CVodeSetPreconditioner", 1) != 0) {
      return (1);
    }
  }

  // CVODE runtime options
  flag = CVodeSetMaxNonlinIters(cvode_mem, max_nls_iters); // Max newton iter.
  if (utils::check_flag(&flag, "CVodeSetMaxNonlinIters", 1) != 0) {
    return (1);
  }
  flag = CVodeSetMaxErrTestFails(cvode_mem, 100); // Max Err.test failure
  if (utils::check_flag(&flag, "CVodeSetMaxErrTestFails", 1) != 0) {
    return (1);
  }
  flag = CVodeSetErrHandlerFn(
    cvode_mem, cvode::cvodeErrHandler, nullptr); // Err. handler funct.
  if (utils::check_flag(&flag, "CVodeSetErrHandlerFn", 1) != 0) {
    return (1);
  }
  flag = CVodeSetMaxNumSteps(cvode_mem, 10000); // Max substeps
  if (utils::check_flag(&flag, "CVodeSetMaxNumSteps", 1) != 0) {
    return (1);
  }
  flag = CVodeSetMaxOrd(cvode_mem, udata_g->maxOrder); // Max order
  if (utils::check_flag(&flag, "CVodeSetMaxOrd", 1) != 0) {
    return (1);
  }
  if (LS != nullptr) {
    flag = CVodeSetJacEvalFrequency(cvode_mem, 100); // Max Jac age
    if (utils::check_flag(&flag, "CVodeSetJacEvalFrequency", 1) != 0) {
      return (1);
    }
  }

  // End of CPU section
#endif

  return (0);
}